

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::dump
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor)

{
  error_code ec_00;
  bool bVar1;
  undefined8 uVar2;
  error_code *in_RDI;
  error_code ec;
  basic_json_visitor<char> *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffd8;
  error_category *in_stack_ffffffffffffffe0;
  ser_error *psStack_18;
  
  std::error_code::error_code(in_RDI);
  dump((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)in_RDI,
       in_stack_ffffffffffffffa8,(error_code *)0x1df1b6);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = in_stack_ffffffffffffffe0;
  ec_00._0_8_ = in_stack_ffffffffffffffd8;
  ser_error::ser_error(psStack_18,ec_00);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void dump(basic_json_visitor<char_type>& visitor) const
        {
            std::error_code ec;
            dump(visitor, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec));
            }
        }